

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O3

int Saig_ManHideBadRegs(Aig_Man_t *p,Vec_Ptr_t *vBadRegs)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  void *pvVar5;
  int iVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  Vec_Ptr_t *pVVar9;
  void **__dest;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  
  if (vBadRegs->nSize == 0) {
    iVar17 = 0;
  }
  else {
    iVar17 = p->nRegs;
    if (0 < iVar17) {
      iVar6 = 0;
      do {
        uVar10 = p->nTruePos + iVar6;
        if (((((int)uVar10 < 0) || (p->vCos->nSize <= (int)uVar10)) ||
            (uVar12 = p->nTruePis + iVar6, (int)uVar12 < 0)) || (p->vCis->nSize <= (int)uVar12))
        goto LAB_006f2c46;
        *(void **)((long)p->vCos->pArray[uVar10] + 0x28) = p->vCis->pArray[uVar12];
        iVar6 = iVar6 + 1;
        iVar17 = p->nRegs;
      } while (iVar6 < iVar17);
    }
    pVVar4 = p->vCis;
    pVVar7 = (Vec_Ptr_t *)malloc(0x10);
    iVar6 = pVVar4->nSize;
    pVVar7->nSize = iVar6;
    iVar3 = pVVar4->nCap;
    pVVar7->nCap = iVar3;
    if ((long)iVar3 == 0) {
      ppvVar8 = (void **)0x0;
    }
    else {
      ppvVar8 = (void **)malloc((long)iVar3 << 3);
    }
    pVVar7->pArray = ppvVar8;
    memcpy(ppvVar8,pVVar4->pArray,(long)iVar6 * 8);
    pVVar4 = p->vCos;
    pVVar9 = (Vec_Ptr_t *)malloc(0x10);
    iVar3 = pVVar4->nSize;
    pVVar9->nSize = iVar3;
    iVar11 = pVVar4->nCap;
    pVVar9->nCap = iVar11;
    if ((long)iVar11 == 0) {
      __dest = (void **)0x0;
    }
    else {
      __dest = (void **)malloc((long)iVar11 << 3);
    }
    pVVar9->pArray = __dest;
    memcpy(__dest,pVVar4->pArray,(long)iVar3 * 8);
    uVar10 = p->nObjs[2] - iVar17;
    if (uVar10 != p->nTruePis) {
      __assert_fail("nTruePi == p->nTruePis",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigRetMin.c"
                    ,0x1fa,"int Saig_ManHideBadRegs(Aig_Man_t *, Vec_Ptr_t *)");
    }
    uVar12 = p->nObjs[3] - iVar17;
    if (uVar12 != p->nTruePos) {
      __assert_fail("nTruePo == p->nTruePos",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigRetMin.c"
                    ,0x1fb,"int Saig_ManHideBadRegs(Aig_Man_t *, Vec_Ptr_t *)");
    }
    if (0 < vBadRegs->nSize) {
      lVar15 = 0;
      do {
        if (((int)uVar10 < 0) || (iVar6 <= (int)(uVar10 + (int)lVar15))) goto LAB_006f2c65;
        pvVar5 = vBadRegs->pArray[lVar15];
        ppvVar8[(ulong)uVar10 + lVar15] = *(void **)((long)pvVar5 + 0x28);
        if (((int)uVar12 < 0) || (iVar3 <= (int)(uVar12 + (int)lVar15))) goto LAB_006f2c65;
        __dest[(ulong)uVar12 + lVar15] = pvVar5;
        *(byte *)((long)pvVar5 + 0x18) = *(byte *)((long)pvVar5 + 0x18) | 0x10;
        lVar15 = lVar15 + 1;
      } while (lVar15 < vBadRegs->nSize);
      uVar10 = uVar10 + (int)lVar15;
      uVar12 = uVar12 + (int)lVar15;
      iVar17 = p->nRegs;
    }
    if (0 < iVar17) {
      iVar11 = 0;
      do {
        uVar13 = p->nTruePos + iVar11;
        if ((((int)uVar13 < 0) || (p->vCos->nSize <= (int)uVar13)) ||
           ((uVar14 = p->nTruePis + iVar11, (int)uVar14 < 0 || (p->vCis->nSize <= (int)uVar14)))) {
LAB_006f2c46:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar5 = p->vCos->pArray[uVar13];
        if ((*(ulong *)((long)pvVar5 + 0x18) & 0x10) == 0) {
          if (((((int)uVar10 < 0) || (iVar6 <= (int)uVar10)) ||
              (ppvVar8[uVar10] = p->vCis->pArray[uVar14], (int)uVar12 < 0)) ||
             (iVar3 <= (int)uVar12)) {
LAB_006f2c65:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          uVar10 = uVar10 + 1;
          uVar16 = (ulong)uVar12;
          uVar12 = uVar12 + 1;
          __dest[uVar16] = pvVar5;
        }
        else {
          *(ulong *)((long)pvVar5 + 0x18) = *(ulong *)((long)pvVar5 + 0x18) & 0xffffffffffffffef;
          iVar17 = p->nRegs;
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 < iVar17);
    }
    if (uVar10 != p->nObjs[2]) {
      __assert_fail("nTruePi == Aig_ManCiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigRetMin.c"
                    ,0x20d,"int Saig_ManHideBadRegs(Aig_Man_t *, Vec_Ptr_t *)");
    }
    if (uVar12 != p->nObjs[3]) {
      __assert_fail("nTruePo == Aig_ManCoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigRetMin.c"
                    ,0x20e,"int Saig_ManHideBadRegs(Aig_Man_t *, Vec_Ptr_t *)");
    }
    pVVar4 = p->vCis;
    ppvVar8 = pVVar4->pArray;
    if (ppvVar8 != (void **)0x0) {
      free(ppvVar8);
    }
    free(pVVar4);
    p->vCis = pVVar7;
    pVVar4 = p->vCos;
    ppvVar8 = pVVar4->pArray;
    if (ppvVar8 != (void **)0x0) {
      free(ppvVar8);
    }
    free(pVVar4);
    p->vCos = pVVar9;
    iVar17 = vBadRegs->nSize;
    p->nRegs = p->nRegs - iVar17;
    uVar1 = p->nTruePis;
    uVar2 = p->nTruePos;
    p->nTruePis = iVar17 + uVar1;
    p->nTruePos = iVar17 + uVar2;
  }
  return iVar17;
}

Assistant:

int Saig_ManHideBadRegs( Aig_Man_t * p, Vec_Ptr_t * vBadRegs )
{
    Vec_Ptr_t * vPisNew, * vPosNew;
    Aig_Obj_t * pObjLi, * pObjLo;
    int nTruePi, nTruePo, nBadRegs, i;
    if ( Vec_PtrSize(vBadRegs) == 0 )
        return 0;
    // attached LOs to LIs
    Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
        pObjLi->pData = pObjLo;
    // reorder them by putting bad registers first
    vPisNew = Vec_PtrDup( p->vCis );
    vPosNew = Vec_PtrDup( p->vCos );
    nTruePi = Aig_ManCiNum(p) - Aig_ManRegNum(p);
    nTruePo = Aig_ManCoNum(p) - Aig_ManRegNum(p);
    assert( nTruePi == p->nTruePis );
    assert( nTruePo == p->nTruePos );
    Vec_PtrForEachEntry( Aig_Obj_t *, vBadRegs, pObjLi, i )
    {
        Vec_PtrWriteEntry( vPisNew, nTruePi++, pObjLi->pData );
        Vec_PtrWriteEntry( vPosNew, nTruePo++, pObjLi );
        pObjLi->fMarkA = 1;
    }
    Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
    {
        if ( pObjLi->fMarkA )
        {
            pObjLi->fMarkA = 0;
            continue;
        }
        Vec_PtrWriteEntry( vPisNew, nTruePi++, pObjLo );
        Vec_PtrWriteEntry( vPosNew, nTruePo++, pObjLi );
    }
    // check the sizes
    assert( nTruePi == Aig_ManCiNum(p) );
    assert( nTruePo == Aig_ManCoNum(p) );
    // transfer the arrays
    Vec_PtrFree( p->vCis ); p->vCis = vPisNew;
    Vec_PtrFree( p->vCos ); p->vCos = vPosNew;
    // update the PIs
    nBadRegs = Vec_PtrSize(vBadRegs);
    p->nRegs -= nBadRegs;
    p->nTruePis += nBadRegs;
    p->nTruePos += nBadRegs;
    return nBadRegs;
}